

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::InfoLog::~InfoLog(InfoLog *this)

{
  ~InfoLog(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~InfoLog			(void) {}